

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedStringView::GenerateByteSize
          (RepeatedStringView *this,Printer *p)

{
  io::Printer::Emit(p,0x126,
                    "\n      total_size +=\n          $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$().size());\n      for (int i = 0, n = this_._internal_$name$().size(); i < n; ++i) {\n        total_size += $pbi$::WireFormatLite::$DeclaredType$Size(\n            this_._internal_$name$().Get(i));\n      }\n    "
                   );
  return;
}

Assistant:

void GenerateByteSize(io::Printer* p) const override {
    p->Emit(R"cc(
      total_size +=
          $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$().size());
      for (int i = 0, n = this_._internal_$name$().size(); i < n; ++i) {
        total_size += $pbi$::WireFormatLite::$DeclaredType$Size(
            this_._internal_$name$().Get(i));
      }
    )cc");
  }